

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v10::detail::write<char,fmt::v10::appender>
          (detail *this,appender out,basic_string_view<char> s,format_specs<char> *specs)

{
  presentation_type pVar1;
  anon_class_24_3_b33ccaaf_for_f f;
  char *pcVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> width;
  appender aVar3;
  format_specs<char> *specs_00;
  count_code_points f_00;
  char *size;
  string_view s_00;
  basic_string_view<char> str;
  string_view s_01;
  size_t num_code_points;
  size_t result;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_68;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_60;
  char **local_58;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  specs_00 = (format_specs<char> *)s.size_;
  str.size_ = s.data_;
  pcVar2 = (char *)(long)specs_00->precision;
  f_00.count = (size_t *)specs_00;
  size = str.size_;
  if ((-1 < (long)pcVar2) && (pcVar2 < str.size_)) {
    f_00.count = (size_t *)&local_38;
    local_58 = &local_40;
    f.n = f_00.count;
    f.begin = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    f.result = (size_t *)local_58;
    s_00.size_ = (size_t)str.size_;
    s_00.data_ = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    local_68 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    bStack_60.container = (buffer<char> *)f_00.count;
    local_40 = str.size_;
    local_38 = pcVar2;
    for_each_codepoint<fmt::v10::detail::code_point_index(fmt::v10::basic_string_view<char>,unsigned_long)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
              (s_00,f);
    size = local_40;
  }
  pVar1 = specs_00->type;
  if (specs_00->width == 0) {
    width.container = (buffer<char> *)0x0;
  }
  else if (pVar1 == debug) {
    str.data_ = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    width.container =
         (buffer<char> *)
         write_escaped_string<char,fmt::v10::detail::counting_iterator>((counting_iterator)0x0,str);
  }
  else {
    local_68.container = (buffer<char> *)0x0;
    s_01.size_ = (size_t)&local_68;
    s_01.data_ = size;
    for_each_codepoint<fmt::v10::detail::compute_width(fmt::v10::basic_string_view<char>)::count_code_points>
              ((detail *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
               s_01,f_00);
    width.container = local_68.container;
  }
  local_68.container._0_1_ = pVar1 == debug;
  bStack_60 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_58 = (char **)str.size_;
  local_50 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_48 = size;
  aVar3 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write<char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)this,specs_00,(size_t)size,(size_t)width.container,
                     (anon_class_40_4_6b3cdfe0 *)&local_68);
  return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  bool is_debug = specs.type == presentation_type::debug;
  size_t width = 0;
  if (specs.width != 0) {
    if (is_debug)
      width = write_escaped_string(counting_iterator{}, s).count();
    else
      width = compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        if (is_debug) return write_escaped_string(it, s);
                        return copy_str<Char>(data, data + size, it);
                      });
}